

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assign_inliner.cpp
# Opt level: O0

unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> __thiscall
verilogAST::AssignInliner::visit
          (AssignInliner *this,
          unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *node)

{
  bool bVar1;
  pointer pEVar2;
  pointer pIVar3;
  mapped_type *this_00;
  int __flags;
  AssignInliner *pAVar4;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *in_RDX;
  void *__child_stack;
  void *in_R8;
  pointer local_c8;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_98;
  undefined4 local_8c;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_88;
  string local_80;
  undefined1 local_50 [8];
  string key;
  unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_> id;
  Identifier *ptr;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *node_local;
  AssignInliner *this_local;
  
  pAVar4 = this;
  pEVar2 = std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
           get(in_RDX);
  __flags = (int)pAVar4;
  if (pEVar2 == (pointer)0x0) {
    local_c8 = (pointer)0x0;
  }
  else {
    __flags = 0;
    local_c8 = (pointer)__dynamic_cast(pEVar2,&Expression::typeinfo,&Identifier::typeinfo);
  }
  if (local_c8 == (pointer)0x0) {
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
    unique_ptr(&local_98,in_RDX);
    Transformer::visit(&this->super_Transformer,node);
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
    ~unique_ptr(&local_98);
  }
  else {
    std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::release
              (in_RDX);
    std::unique_ptr<verilogAST::Identifier,std::default_delete<verilogAST::Identifier>>::
    unique_ptr<std::default_delete<verilogAST::Identifier>,void>
              ((unique_ptr<verilogAST::Identifier,std::default_delete<verilogAST::Identifier>> *)
               (key.field_2._M_local_buf + 8),local_c8);
    pIVar3 = std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>::
             operator->((unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>
                         *)(key.field_2._M_local_buf + 8));
    (**(pIVar3->super_Expression).super_Node._vptr_Node)(local_50);
    std::__cxx11::string::string((string *)&local_80,(string *)local_50);
    bVar1 = can_inline((AssignInliner *)node,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    if (bVar1) {
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                              *)(node + 0xd),(key_type *)local_50);
      pEVar2 = std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
               ::operator->(this_00);
      Expression::clone((Expression *)&local_88,(__fn *)pEVar2,__child_stack,__flags,in_R8);
      (*(code *)(((node->_M_t).
                  super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                  .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl)->super_Node)
                ._vptr_Node)(this,node,&local_88);
      std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
      ~unique_ptr(&local_88);
    }
    else {
      std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>::
      unique_ptr<verilogAST::Identifier,std::default_delete<verilogAST::Identifier>,void>
                ((unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>> *)
                 this,(unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>
                       *)((long)&key.field_2 + 8));
    }
    local_8c = 1;
    std::__cxx11::string::~string((string *)local_50);
    std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>::
    ~unique_ptr((unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_> *)
                ((long)&key.field_2 + 8));
  }
  return (__uniq_ptr_data<verilogAST::Expression,_std::default_delete<verilogAST::Expression>,_true,_true>
          )(__uniq_ptr_data<verilogAST::Expression,_std::default_delete<verilogAST::Expression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Expression> AssignInliner::visit(
    std::unique_ptr<Expression> node) {
  if (auto ptr = dynamic_cast<Identifier*>(node.get())) {
    node.release();
    std::unique_ptr<Identifier> id(ptr);
    std::string key = id->toString();
    if (this->can_inline(key)) {
      return this->visit(assign_map[key]->clone());
    }
    return id;
  }
  return Transformer::visit(std::move(node));
}